

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

QRegion __thiscall QMdiSubWindowPrivate::getRegion(QMdiSubWindowPrivate *this,Operation operation)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  QRegionData *pQVar2;
  QRect QVar3;
  int iVar4;
  int iVar5;
  QStyle *pQVar6;
  QProxyStyle *this_01;
  int in_EDX;
  long lVar7;
  undefined4 in_register_00000034;
  QMdiSubWindowPrivate *this_02;
  QRect *this_03;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  QRect QVar12;
  QRegion *region;
  QStyleOptionTitleBar titleBarOptions;
  QRect local_c0;
  QRegion local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  this_02 = (QMdiSubWindowPrivate *)CONCAT44(in_register_00000034,operation);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this_02->super_QWidgetPrivate).field_0x8;
  pQVar1 = this_00->data;
  iVar8 = (pQVar1->crect).y2.m_i;
  iVar10 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  iVar9 = (pQVar1->crect).y1.m_i;
  iVar4 = titleBarHeight(this_02);
  pQVar6 = QWidget::style(this_00);
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x2c,0,this_00);
  iVar11 = iVar4 - iVar5;
  if (in_EDX == 1) {
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_02);
    *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
    lVar7 = 0;
    QRegion::QRegion((QRegion *)this,iVar5,iVar5,iVar10 + iVar5 * -2,iVar11,Rectangle);
    do {
      if (lVar7 != 0) {
        pQVar6 = QWidget::style(this_00);
        QVar12 = (QRect)(**(code **)(*(long *)pQVar6 + 0xd8))
                                  (pQVar6,5,local_a8,*(undefined4 *)((long)SubControls + lVar7),0);
        local_c0 = QVar12;
        QRegion::QRegion(&local_b0,&local_c0,Rectangle);
        QRegion::operator-=((QRegion *)this,&local_b0);
        QRegion::~QRegion(&local_b0);
      }
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x24);
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
    QVar12 = local_c0;
    goto LAB_0045498c;
  }
  *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  pQVar6 = QWidget::style(this_00);
  this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
  if (this_01 != (QProxyStyle *)0x0) {
    pQVar6 = QProxyStyle::baseStyle(this_01);
  }
  lVar7 = (**(code **)(*(long *)pQVar6 + 8))(pQVar6,"QMacStyle");
  QVar3.x2.m_i = local_c0.x2.m_i;
  QVar3.y2.m_i = local_c0.y2.m_i;
  QVar3.x1.m_i = local_c0.x1.m_i;
  QVar3.y1.m_i = local_c0.y1.m_i;
  QVar12.x2.m_i = local_c0.x2.m_i;
  QVar12.y2.m_i = local_c0.y2.m_i;
  QVar12.x1.m_i = local_c0.x1.m_i;
  QVar12.y1.m_i = local_c0.y1.m_i;
  if ((lVar7 != 0) || (QVar12 = QVar3, 7 < in_EDX - 2U)) goto LAB_0045498c;
  iVar8 = (iVar8 - iVar9) + 1;
  iVar9 = iVar5;
  switch(in_EDX) {
  case 2:
    iVar8 = 0;
    goto LAB_004548ca;
  case 3:
    iVar8 = iVar8 - iVar5;
LAB_004548ca:
    iVar11 = iVar10 + iVar4 * -2;
LAB_004548d0:
    this_03 = (QRect *)local_a8;
    QRegion::QRegion((QRegion *)local_a8,iVar4,iVar8,iVar11,iVar9,Rectangle);
    pQVar2 = *(QRegionData **)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate = local_a8._0_8_;
    local_a8._0_8_ = pQVar2;
    goto LAB_00454987;
  case 4:
    iVar10 = 0;
    goto LAB_00454836;
  case 5:
    iVar10 = iVar10 - iVar5;
LAB_00454836:
    iVar9 = iVar8 + iVar4 * -2;
    iVar11 = iVar5;
    iVar8 = iVar4;
    iVar4 = iVar10;
    goto LAB_004548d0;
  case 6:
    QRegion::QRegion((QRegion *)&local_c0,0,0,iVar4,iVar4,Rectangle);
    break;
  case 7:
    QRegion::QRegion((QRegion *)&local_c0,iVar10 - iVar4,0,iVar4,iVar4,Rectangle);
    iVar5 = iVar10 - iVar4;
    break;
  case 8:
    QRegion::QRegion((QRegion *)&local_c0,0,iVar8 - iVar4,iVar4,iVar4,Rectangle);
    iVar9 = iVar8 - iVar4;
    break;
  case 9:
    this_03 = &local_c0;
    QRegion::QRegion((QRegion *)this_03,iVar10 - iVar4,iVar8 - iVar4,iVar4,iVar4,Rectangle);
    QRegion::QRegion(&local_b0,iVar10 - iVar4,iVar8 - iVar4,iVar11,iVar11,Rectangle);
    QRegion::operator-((QRegion *)local_a8,(QRegion *)this_03);
    pQVar2 = *(QRegionData **)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate = local_a8._0_8_;
    local_a8._0_8_ = pQVar2;
    QRegion::~QRegion((QRegion *)local_a8);
    QRegion::~QRegion(&local_b0);
    goto LAB_00454987;
  }
  this_03 = &local_c0;
  QRegion::QRegion(&local_b0,iVar5,iVar9,iVar11,iVar11,Rectangle);
  QRegion::operator-((QRegion *)local_a8,(QRegion *)this_03);
  pQVar2 = *(QRegionData **)&this->super_QWidgetPrivate;
  *(undefined8 *)&this->super_QWidgetPrivate = local_a8._0_8_;
  local_a8._0_8_ = pQVar2;
  QRegion::~QRegion((QRegion *)local_a8);
  QRegion::~QRegion(&local_b0);
LAB_00454987:
  QRegion::~QRegion((QRegion *)this_03);
  QVar12.x2.m_i = local_c0.x2.m_i;
  QVar12.y2.m_i = local_c0.y2.m_i;
  QVar12.x1.m_i = local_c0.x1.m_i;
  QVar12.y1.m_i = local_c0.y1.m_i;
LAB_0045498c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_c0 = QVar12;
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QMdiSubWindowPrivate::getRegion(Operation operation) const
{
    Q_Q(const QMdiSubWindow);
    int width = q->width();
    int height = q->height();
    int titleBarHeight = this->titleBarHeight();
    int frameWidth = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);
    int cornerConst = titleBarHeight - frameWidth;
    int titleBarConst = 2 * titleBarHeight;

    if (operation == Move) {
        QStyleOptionTitleBar titleBarOptions = this->titleBarOptions();
        QRegion move(frameWidth, frameWidth, width - 2 * frameWidth, cornerConst);
        // Depending on which window flags are set, activated sub controllers will
        // be subtracted from the 'move' region.
        for (int i = 0; i < NumSubControls; ++i) {
            if (SubControls[i] == QStyle::SC_TitleBarLabel)
                continue;
            move -= QRegion(q->style()->subControlRect(QStyle::CC_TitleBar, &titleBarOptions,
                            SubControls[i]));
        }
        return move;
    }

    QRegion region;
    if (isMacStyle(q->style()))
        return region;

    switch (operation) {
    case TopResize:
        region = QRegion(titleBarHeight, 0, width - titleBarConst, frameWidth);
        break;
    case BottomResize:
        region = QRegion(titleBarHeight, height - frameWidth, width - titleBarConst, frameWidth);
        break;
    case LeftResize:
        region = QRegion(0, titleBarHeight, frameWidth, height - titleBarConst);
        break;
    case RightResize:
        region = QRegion(width - frameWidth, titleBarHeight, frameWidth, height - titleBarConst);
        break;
    case TopLeftResize:
        region = QRegion(0, 0, titleBarHeight, titleBarHeight)
                 - QRegion(frameWidth, frameWidth, cornerConst, cornerConst);
        break;
    case TopRightResize:
        region =  QRegion(width - titleBarHeight, 0, titleBarHeight, titleBarHeight)
                  - QRegion(width - titleBarHeight, frameWidth, cornerConst, cornerConst);
        break;
    case BottomLeftResize:
        region = QRegion(0, height - titleBarHeight, titleBarHeight, titleBarHeight)
                 - QRegion(frameWidth, height - titleBarHeight, cornerConst, cornerConst);
        break;
    case BottomRightResize:
        region = QRegion(width - titleBarHeight, height - titleBarHeight, titleBarHeight, titleBarHeight)
                 - QRegion(width - titleBarHeight, height - titleBarHeight, cornerConst, cornerConst);
        break;
    default:
        break;
    }

    return region;
}